

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9HashmapRelease(jx9_hashmap *pMap,int FreeDS)

{
  jx9_vm *pVm;
  jx9_hashmap_node *pjVar1;
  uint uVar2;
  sxi32 sVar3;
  uint uVar4;
  jx9_hashmap_node *pChunk;
  
  pVm = pMap->pVm;
  pChunk = pMap->pFirst;
  for (uVar4 = 0; uVar2 = pMap->nEntry, uVar4 < uVar2; uVar4 = uVar4 + 1) {
    pjVar1 = pChunk->pPrev;
    jx9VmUnsetMemObj(pVm,pChunk->nValIdx);
    if (pChunk->iType == 2) {
      SyBlobRelease(&(pChunk->xKey).sKey);
    }
    SyMemBackendPoolFree(&pVm->sAllocator,pChunk);
    pChunk = pjVar1;
  }
  if (uVar2 != 0) {
    uVar2 = SyMemBackendFree(&pVm->sAllocator,pMap->apBucket);
  }
  if (FreeDS != 0) {
    sVar3 = SyMemBackendPoolFree(&pVm->sAllocator,pMap);
    return sVar3;
  }
  pMap->iNextIdx = 0;
  pMap->apBucket = (jx9_hashmap_node **)0x0;
  pMap->pFirst = (jx9_hashmap_node *)0x0;
  pMap->pLast = (jx9_hashmap_node *)0x0;
  pMap->pCur = (jx9_hashmap_node *)0x0;
  pMap->nSize = 0;
  pMap->nEntry = 0;
  return uVar2;
}

Assistant:

JX9_PRIVATE sxi32 jx9HashmapRelease(jx9_hashmap *pMap, int FreeDS)
{
	jx9_hashmap_node *pEntry, *pNext;
	jx9_vm *pVm = pMap->pVm;
	sxu32 n;
	/* Start the release process */
	n = 0;
	pEntry = pMap->pFirst;
	for(;;){
		if( n >= pMap->nEntry ){
			break;
		}
		pNext = pEntry->pPrev; /* Reverse link */
		/* Restore the jx9_value to the free list */
		jx9VmUnsetMemObj(pVm, pEntry->nValIdx);
		/* Release the node */
		if( pEntry->iType == HASHMAP_BLOB_NODE ){
			SyBlobRelease(&pEntry->xKey.sKey);
		}
		SyMemBackendPoolFree(&pVm->sAllocator, pEntry);
		/* Point to the next entry */
		pEntry = pNext;
		n++;
	}
	if( pMap->nEntry > 0 ){
		/* Release the hash bucket */
		SyMemBackendFree(&pVm->sAllocator, pMap->apBucket);
	}
	if( FreeDS ){
		/* Free the whole instance */
		SyMemBackendPoolFree(&pVm->sAllocator, pMap);
	}else{
		/* Keep the instance but reset it's fields */
		pMap->apBucket = 0;
		pMap->iNextIdx = 0;
		pMap->nEntry = pMap->nSize = 0;
		pMap->pFirst = pMap->pLast = pMap->pCur = 0;
	}
	return SXRET_OK;
}